

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O2

void __thiscall CRegister::CRegister(CRegister *this)

{
  this->m_RegisterStateStart = 0;
  this->m_RegisterState = 0;
  this->m_pNetServer = (CNetServer *)0x0;
  this->m_pMasterServer = (IEngineMasterServer *)0x0;
  this->m_pConfig = (CConfig *)0x0;
  this->m_pConsole = (IConsole *)0x0;
  this->m_RegisterFirst = 1;
  this->m_RegisterCount = 0;
  mem_zero(this->m_aMasterserverInfo,0xa0);
  this->m_RegisterRegisteredServer = -1;
  return;
}

Assistant:

CRegister::CRegister()
{
	m_pNetServer = 0;
	m_pMasterServer = 0;
	m_pConfig = 0;
	m_pConsole = 0;

	m_RegisterState = REGISTERSTATE_START;
	m_RegisterStateStart = 0;
	m_RegisterFirst = 1;
	m_RegisterCount = 0;

	mem_zero(m_aMasterserverInfo, sizeof(m_aMasterserverInfo));
	m_RegisterRegisteredServer = -1;
}